

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_set_input_script(wally_tx *tx,size_t index,uchar *script,size_t script_len)

{
  _Bool _Var1;
  int iVar2;
  wally_tx_input *input;
  
  _Var1 = is_valid_tx(tx);
  if ((_Var1) && (index < tx->num_inputs)) {
    input = tx->inputs + index;
  }
  else {
    input = (wally_tx_input *)0x0;
  }
  _Var1 = is_valid_tx_input(input);
  if (_Var1) {
    iVar2 = replace_bytes(script,script_len,&input->script,&input->script_len);
    return iVar2;
  }
  return -2;
}

Assistant:

int wally_tx_clone_alloc(const struct wally_tx *tx, uint32_t flags, struct wally_tx **output)
{
    size_t i;
    struct wally_tx *result = NULL;
    int ret;

    TX_CHECK_OUTPUT;

    if (!is_valid_tx(tx) || flags != 0)
        return WALLY_EINVAL;

    ret = wally_tx_init_alloc(tx->version, tx->locktime, tx->num_inputs, tx->num_outputs, &result);

    for (i = 0; ret == WALLY_OK && i < tx->num_inputs; ++i)
        ret = wally_tx_add_input(result, &tx->inputs[i]);

    for (i = 0; ret == WALLY_OK && i < tx->num_outputs; ++i)
        ret = wally_tx_add_output(result, &tx->outputs[i]);

    if (ret == WALLY_OK)
        *output = result;
    else
        wally_tx_free(result);

    return ret;
}